

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O1

void __thiscall QThreadData::clearEvents(QThreadData *this)

{
  int *piVar1;
  long lVar2;
  QPostEvent *pQVar3;
  long *plVar4;
  long lVar5;
  
  lVar2 = (this->postEventList).super_QList<QPostEvent>.d.size;
  if (lVar2 != 0) {
    pQVar3 = (this->postEventList).super_QList<QPostEvent>.d.ptr;
    lVar5 = 0;
    do {
      if (*(long *)((long)&pQVar3->event + lVar5) != 0) {
        LOCK();
        piVar1 = (int *)(*(long *)(*(long *)((long)&pQVar3->receiver + lVar5) + 8) + 0x34);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        plVar4 = *(long **)((long)&pQVar3->event + lVar5);
        *(undefined1 *)((long)plVar4 + 10) = 0;
        if (plVar4 != (long *)0x0) {
          (**(code **)(*plVar4 + 8))();
        }
      }
      lVar5 = lVar5 + 0x18;
    } while (lVar2 * 0x18 != lVar5);
  }
  QList<QPostEvent>::clear(&(this->postEventList).super_QList<QPostEvent>);
  return;
}

Assistant:

void QThreadData::clearEvents()
{
    for (const auto &pe : std::as_const(postEventList)) {
        if (pe.event) {
            pe.receiver->d_func()->postedEvents.fetchAndSubRelaxed(1);
            pe.event->m_posted = false;
            delete pe.event;
        }
    }
    postEventList.clear();
}